

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> *node)

{
  pointer pIVar1;
  unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_60;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_58 [3];
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  local_40;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  local_30;
  unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pIVar1 = std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>::operator->
                     (in_RDX);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  ::variant(&local_40,&pIVar1->value);
  visit<std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Attribute,std::default_delete<verilogAST::Attribute>>,std::unique_ptr<verilogAST::Slice,std::default_delete<verilogAST::Slice>>,std::unique_ptr<verilogAST::Index,std::default_delete<verilogAST::Index>>>>
            (&local_30,(Transformer *)node,&local_40);
  pIVar1 = std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>::operator->
                     (in_RDX);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  ::operator=(&pIVar1->value,&local_30);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  ::~variant(&local_30);
  std::
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Attribute,_std::default_delete<verilogAST::Attribute>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>_>
  ::~variant(&local_40);
  pIVar1 = std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_60,&pIVar1->index);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Index,_std::default_delete<verilogAST::Index>_>._M_t
              .super__Tuple_impl<0UL,_verilogAST::Index_*,_std::default_delete<verilogAST::Index>_>.
              super__Head_base<0UL,_verilogAST::Index_*,_false>._M_head_impl)->super_Expression).
            super_Node)(local_58,node,&local_60);
  pIVar1 = std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pIVar1->index,local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_60);
  std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>::unique_ptr
            ((unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_> *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::Index,_std::default_delete<verilogAST::Index>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Index,_std::default_delete<verilogAST::Index>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Index> Transformer::visit(std::unique_ptr<Index> node) {
  node->value = this->visit(std::move(node->value));
  node->index = this->visit(std::move(node->index));
  return node;
}